

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O0

int main(void)

{
  int i;
  double d;
  
  convertMe();
  return 0;
}

Assistant:

int main()
{
    try
    {
        convertMe();
    }
    catch(int i)
    {
        std::cout << "Ups: " << i << std::endl;
    }
    catch(double d)
    {
        std::cout << "Ups: " << d << std::endl;
    }
    return 0;
}